

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall
spdlog::logger::log_<fmt::v7::basic_string_view<char>,short&,short&,unsigned_char&>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,short *args,
          short *args_1,uchar *args_2)

{
  __int_type_conflict _Var1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  log_msg log_msg;
  log_msg local_1b8;
  buffer<char> local_150;
  char local_130 [256];
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if (((int)lvl < iVar2 & (_Var1 ^ 1U)) == 0) {
    local_150.ptr_ = local_130;
    local_150.size_ = 0;
    local_150._vptr_buffer = (_func_int **)&PTR_grow_00147e38;
    local_150.capacity_ = 0xfa;
    local_1b8.logger_name.data_ = (char *)(ulong)(uint)(int)*args;
    local_1b8._16_8_ = ZEXT48((uint)(int)*args_1);
    local_1b8.thread_id = (size_t)*args_2;
    args_00.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_1b8;
    args_00.desc_ = 0x211;
    ::fmt::v7::detail::vformat_to<char>(&local_150,*fmt,args_00,(locale_ref)0x0);
    sVar6 = local_150.size_;
    pcVar5 = local_150.ptr_;
    pcVar3 = (this->name_)._M_dataplus._M_p;
    sVar4 = (this->name_)._M_string_length;
    local_1b8.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_1b8.level = lvl;
    local_1b8.logger_name.data_ = pcVar3;
    local_1b8.logger_name.size_ = sVar4;
    if (*(char *)(in_FS_OFFSET + -8) == '\0') {
      log_<fmt::v7::basic_string_view<char>,short&,short&,unsigned_char&>();
    }
    local_1b8.thread_id = *(size_t *)(in_FS_OFFSET + -0x10);
    local_1b8.color_range_start = 0;
    local_1b8.color_range_end = 0;
    local_1b8.source.filename._0_4_ = loc.filename._0_4_;
    local_1b8.source.filename._4_4_ = loc.filename._4_4_;
    local_1b8.source.line = loc.line;
    local_1b8.source._12_4_ = loc._12_4_;
    local_1b8.source.funcname = loc.funcname;
    local_1b8.payload.data_ = pcVar5;
    local_1b8.payload.size_ = sVar6;
    if (iVar2 <= (int)lvl) {
      (*this->_vptr_logger[3])(this,&local_1b8);
    }
    if ((_Var1 & 1U) != 0) {
      details::backtracer::push_back(&this->tracer_,&local_1b8);
    }
    if (local_150.ptr_ != local_130) {
      operator_delete(local_150.ptr_,local_150.capacity_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }